

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::AssertControlTask::checkArguments
          (AssertControlTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Symbol *symbol;
  SourceLocation SVar2;
  reference ppEVar3;
  SourceLocation in_RCX;
  ASTContext *in_RDX;
  SystemSubroutine *in_RSI;
  SourceLocation in_RDI;
  undefined8 in_R9;
  undefined1 isMethod;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  anon_class_1_0_00000001 isScope;
  size_t i;
  Compilation *comp;
  Type *pTVar4;
  ASTContext *in_stack_ffffffffffffff78;
  SourceLocation SVar5;
  Expression *in_stack_ffffffffffffff90;
  Scope *in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  SourceLocation local_58;
  Type *local_8;
  
  isMethod = (undefined1)((ulong)in_R9 >> 0x38);
  SVar5 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0x9cab2b);
  symbol = (Symbol *)(long)(int)(uint)((*(byte *)((long)in_RDI + 0x38) & 1) != 0);
  pTVar4 = (Type *)0x7fffffff;
  callRange.endLoc = in_RCX;
  callRange.startLoc = SVar5;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RSI,in_RDX,(bool)isMethod,(Args *)this_00,callRange,unaff_retaddr,
                     in_stack_00000008);
  if (bVar1) {
    local_58 = (SourceLocation)0x0;
    while (SVar5 = local_58,
          SVar2 = (SourceLocation)
                  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             0x9cabc6), (ulong)SVar5 < (ulong)SVar2) {
      if ((((*(byte *)((long)in_RDI + 0x38) & 1) == 0) || (3 < (ulong)local_58)) &&
         (((*(byte *)((long)in_RDI + 0x38) & 1) != 0 || (local_58 != (SourceLocation)0x0)))) {
        in_stack_ffffffffffffffa7 = 0;
        ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             in_RDX,(size_type)local_58);
        if ((*ppEVar3)->kind != ArbitrarySymbol) {
LAB_009cacbd:
          not_null<const_slang::ast::Scope_*>::operator->
                    ((not_null<const_slang::ast::Scope_*> *)0x9cacca);
          bVar1 = Scope::isUninstantiated(in_stack_ffffffffffffff98);
          if (!bVar1) {
            ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
                      operator[]((span<const_slang::ast::Expression_*const,_18446744073709551615UL>
                                  *)in_RDX,(size_type)local_58);
            sourceRange.endLoc = in_RDI;
            sourceRange.startLoc = SVar5;
            ASTContext::addDiag(in_stack_ffffffffffffff78,
                                SUB84(((*ppEVar3)->sourceRange).startLoc,4),sourceRange);
          }
          pTVar4 = Compilation::getErrorType(this_00);
          return pTVar4;
        }
        ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             in_RDX,(size_type)local_58);
        Expression::as<slang::ast::ArbitrarySymbolExpression>(*ppEVar3);
        not_null<const_slang::ast::Symbol_*>::operator*
                  ((not_null<const_slang::ast::Symbol_*> *)0x9caca8);
        bVar1 = checkArguments::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)pTVar4,symbol);
        if (!bVar1) goto LAB_009cacbd;
      }
      else {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                  ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,
                   (size_type)local_58);
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x9cac18);
        bVar1 = Type::isIntegral(pTVar4);
        if (!bVar1) {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,
                     (size_type)local_58);
          pTVar4 = SystemSubroutine::badArg
                             ((SystemSubroutine *)
                              CONCAT17(in_stack_ffffffffffffffa7,
                                       CONCAT16(in_stack_ffffffffffffffa6,
                                                CONCAT42(in_stack_ffffffffffffffa2,
                                                         in_stack_ffffffffffffffa0))),
                              (ASTContext *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
          return pTVar4;
        }
      }
      local_58 = (SourceLocation)((long)local_58 + 1);
    }
    local_8 = Compilation::getVoidType(this_00);
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, isFullMethod ? 1 : 0, INT32_MAX))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size(); i++) {
            // If this is $assertcontrol, the first four args are integer expressions.
            // Otherwise, only the first arg is an integer expression. The rest, in both
            // cases, are hierarchical references.
            if ((isFullMethod && i < 4) || (!isFullMethod && i == 0)) {
                if (!args[i]->type->isIntegral())
                    return badArg(context, *args[i]);
            }
            else {
                auto isScope = [](const Symbol& symbol) {
                    return symbol.isScope() || symbol.kind == SymbolKind::Instance;
                };

                if (args[i]->kind != ExpressionKind::ArbitrarySymbol ||
                    !isScope(*args[i]->as<ArbitrarySymbolExpression>().symbol)) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedScopeOrAssert, args[i]->sourceRange);
                    return comp.getErrorType();
                }
            }
        }

        return comp.getVoidType();
    }